

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O0

SUNErrCode SUNHashMap_Values(SUNHashMap map,void ***values,int64_t value_size)

{
  int64_t iVar1;
  void *pvVar2;
  SUNHashMapKeyValue *ppSVar3;
  long in_RDX;
  long *in_RSI;
  long in_RDI;
  SUNHashMapKeyValue kvp;
  int64_t i;
  int count;
  long local_30;
  int local_24;
  SUNErrCode local_4;
  
  local_24 = 0;
  if (in_RDI == 0) {
    local_4 = -9999;
  }
  else {
    iVar1 = SUNHashMap_Capacity((SUNHashMap)0x10f16a);
    pvVar2 = malloc(iVar1 * in_RDX);
    *in_RSI = (long)pvVar2;
    if (in_RSI == (long *)0x0) {
      local_4 = -0x2704;
    }
    else {
      local_30 = 0;
      while( true ) {
        iVar1 = SUNHashMap_Capacity((SUNHashMap)0x10f1b5);
        if (iVar1 <= local_30) break;
        ppSVar3 = SUNStlVector_SUNHashMapKeyValue_At
                            (*(SUNStlVector_SUNHashMapKeyValue *)(in_RDI + 8),local_30);
        if (*ppSVar3 != (SUNHashMapKeyValue)0x0) {
          *(void **)(*in_RSI + (long)local_24 * 8) = (*ppSVar3)->value;
          local_24 = local_24 + 1;
        }
        local_30 = local_30 + 1;
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

SUNDIALS_MAYBE_UNUSED
SUNErrCode SUNHashMap_Values(SUNHashMap map, void*** values, int64_t value_size)
{
  int count = 0;

  if (!map) { return SUN_ERR_ARG_CORRUPT; }

  *values = (void**)malloc(SUNHashMap_Capacity(map) * value_size);
  if (!values) { return SUN_ERR_MALLOC_FAIL; }

  /* Copy the values into a new array */
  for (int64_t i = 0; i < SUNHashMap_Capacity(map); i++)
  {
    SUNHashMapKeyValue kvp = *SUNStlVector_SUNHashMapKeyValue_At(map->buckets, i);
    if (kvp) { (*values)[count++] = kvp->value; }
  }

  return SUN_SUCCESS;
}